

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
EncodeConnectivityFromCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          CornerIndex corner_id)

{
  pointer *ppIVar1;
  int *piVar2;
  ulong *puVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  mapped_type mVar5;
  CornerTable *pCVar6;
  _Bit_type *p_Var7;
  pointer pIVar8;
  pointer piVar9;
  iterator iVar10;
  bool bVar11;
  bool bVar12;
  long lVar13;
  mapped_type *pmVar14;
  int iVar15;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *pIVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar20;
  int iVar21;
  int iVar22;
  iterator iVar23;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *pIVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_68;
  uint local_64;
  int local_60;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_5c;
  int local_58;
  int local_54;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_50;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  MeshEdgebreakerTraversalValenceEncoder *local_40;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  pIVar16 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar23._M_current =
       (this->corner_traversal_stack_).
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar23._M_current != pIVar16) {
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar16;
    iVar23._M_current = pIVar16;
  }
  local_50 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              *)&this->corner_traversal_stack_;
  if (iVar23._M_current ==
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_68.value_ = corner_id.value_;
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              (local_50,iVar23,&local_68);
    pIVar16 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar24 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar23._M_current)->value_ = corner_id.value_;
    pIVar24 = iVar23._M_current + 1;
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar24;
  }
  if (pIVar16 != pIVar24) {
    local_54 = (int)((ulong)((long)(this->mesh_->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mesh_->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->processed_connectivity_corners_;
    local_40 = &this->traversal_encoder_;
    local_48 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->face_to_split_symbol_map_;
    do {
      IVar20.value_ = pIVar24[-1].value_;
      if ((IVar20.value_ == 0xffffffff) ||
         ((*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     + (ulong)(IVar20.value_ / 0x18 & 0xfffffff8)) >>
           ((ulong)IVar20.value_ / 3 & 0x3f) & 1) != 0)) {
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar24 + -1;
      }
      else {
        iVar25 = local_54;
        if (0 < local_54) {
          do {
            this->last_encoded_symbol_id_ = this->last_encoded_symbol_id_ + 1;
            uVar27 = (ulong)IVar20.value_ / 3;
            if (IVar20.value_ == 0xffffffff) {
              uVar27 = 0xffffffff;
            }
            uVar26 = (uint)uVar27;
            puVar3 = (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar27 >> 6)
            ;
            *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
            iVar23._M_current =
                 (this->processed_connectivity_corners_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_68.value_ = IVar20.value_;
            if (iVar23._M_current ==
                (this->processed_connectivity_corners_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                        (local_38,iVar23,&local_68);
            }
            else {
              (iVar23._M_current)->value_ = IVar20.value_;
              (this->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar23._M_current + 1;
            }
            (this->traversal_encoder_).last_corner_.value_ = local_68.value_;
            pCVar6 = (this->corner_table_)._M_t.
                     super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
            if ((ulong)local_68.value_ == 0xffffffff) {
              uVar27 = 0xffffffff;
            }
            else {
              uVar27 = (ulong)*(uint *)(*(long *)&(pCVar6->corner_to_vertex_map_).vector_ +
                                       (ulong)local_68.value_ * 4);
            }
            p_Var7 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            iVar15 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27];
            uVar17 = p_Var7[uVar27 >> 6];
            if (((uVar17 >> (uVar27 & 0x3f) & 1) == 0) &&
               (p_Var7[uVar27 >> 6] = uVar17 | 1L << (uVar27 & 0x3f), iVar15 == -1)) {
              piVar2 = &(this->traversal_encoder_).num_symbols_;
              *piVar2 = *piVar2 + 1;
              if (local_68.value_ == 0xffffffff) {
                uVar26 = 0xffffffff;
                uVar18 = 0xffffffff;
              }
              else {
                uVar26 = local_68.value_ - 2;
                if (0x55555555 < local_68.value_ * -0x55555555 + 0xaaaaaaab) {
                  uVar26 = local_68.value_ + 1;
                }
                if (local_68.value_ * -0x55555555 < 0x55555556) {
                  uVar18 = local_68.value_ + 2;
                }
                else {
                  uVar18 = local_68.value_ - 1;
                }
              }
              pIVar8 = (this->traversal_encoder_).corner_to_vertex_map_.vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar9 = (this->traversal_encoder_).vertex_valences_.vector_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              uVar26 = pIVar8[uVar26].value_;
              iVar15 = piVar9[uVar26];
              piVar9[uVar26] = iVar15 + -1;
              piVar9[pIVar8[uVar18].value_] = piVar9[pIVar8[uVar18].value_] + -1;
              lVar13 = (long)(this->traversal_encoder_).prev_symbol_;
              if (lVar13 != -1) {
                iVar22 = (this->traversal_encoder_).min_valence_;
                iVar21 = (this->traversal_encoder_).max_valence_;
                if (iVar15 < iVar21) {
                  iVar21 = iVar15;
                }
                iVar21 = iVar21 - iVar22;
                if (iVar15 < iVar22) {
                  iVar21 = 0;
                }
                pvVar4 = (this->traversal_encoder_).context_symbols_.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar21;
                local_64 = *(uint *)(edge_breaker_topology_to_symbol_id + lVar13 * 4);
                iVar10._M_current =
                     (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>(pvVar4,iVar10,&local_64);
                }
                else {
                  *iVar10._M_current = local_64;
                  (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                }
              }
              (this->traversal_encoder_).prev_symbol_ = 0;
              IVar20.value_ = 0xffffffff;
              if (local_68.value_ != 0xffffffff) {
                uVar26 = local_68.value_ - 2;
                if (0x55555555 < (local_68.value_ + 1) * -0x55555555) {
                  uVar26 = local_68.value_ + 1;
                }
                if (uVar26 != 0xffffffff) {
                  IVar20.value_ =
                       *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                             .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                            _M_head_impl)->opposite_corners_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                + (ulong)uVar26 * 4);
                }
              }
            }
            else {
              local_60 = iVar25;
              if (local_68.value_ == 0xffffffff) {
                local_5c.value_ = 0xffffffff;
LAB_0013fad1:
                bVar12 = IsRightFaceVisited(this,(CornerIndex)local_68.value_);
                bVar11 = IsLeftFaceVisited(this,(CornerIndex)local_68.value_);
                if (!bVar12) {
                  iVar25 = local_60;
                  if (bVar11) goto LAB_0013fc3b;
                  IVar20.value_ = 0xffffffff;
                  local_58 = iVar15;
LAB_0013ffcc:
                  MeshEdgebreakerTraversalValenceEncoder::EncodeSymbol(local_40,TOPOLOGY_S);
                  this->num_split_symbols_ = this->num_split_symbols_ + 1;
                  if (local_58 != -1) {
                    iVar25 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar27];
                    uVar27 = (ulong)iVar25;
                    iVar15 = iVar25 + 0x3f;
                    if (-1 < (long)uVar27) {
                      iVar15 = iVar25;
                    }
                    if (((this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [(long)(iVar15 >> 6) +
                          (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff] >> (uVar27 & 0x3f) & 1) == 0) {
                      EncodeHole(this,(CornerIndex)local_68.value_,false);
                    }
                  }
                  mVar5 = this->last_encoded_symbol_id_;
                  local_64 = uVar26;
                  pmVar14 = std::__detail::
                            _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[](local_48,(key_type *)&local_64);
                  *pmVar14 = mVar5;
                  iVar23._M_current =
                       (this->corner_traversal_stack_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  iVar23._M_current[-1].value_ = IVar20.value_;
                  if (iVar23._M_current ==
                      (this->corner_traversal_stack_).
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    ::
                    _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                              (local_50,iVar23,&local_5c);
                  }
                  else {
                    (iVar23._M_current)->value_ = local_5c.value_;
                    (this->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar23._M_current + 1;
                  }
                  break;
                }
                IVar20.value_ = 0xffffffff;
                if (bVar11) goto LAB_0013ff77;
              }
              else {
                uVar18 = local_68.value_ - 2;
                if (0x55555555 < (local_68.value_ + 1) * -0x55555555) {
                  uVar18 = local_68.value_ + 1;
                }
                if (uVar18 == 0xffffffff) {
                  uVar17 = 0xffffffff;
                }
                else {
                  uVar17 = (ulong)*(uint *)(*(long *)&(pCVar6->opposite_corners_).vector_.
                                                                                                            
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                           + (ulong)uVar18 * 4);
                }
                local_5c.value_ = (uint)uVar17;
                if (local_68.value_ * -0x55555555 < 0x55555556) {
                  uVar18 = local_68.value_ + 2;
                  if (uVar18 != 0xffffffff) goto LAB_0013fb36;
                  local_58 = iVar15;
                  if (local_5c.value_ == 0xffffffff) goto LAB_0013fad1;
                  iVar25 = (int)(uVar17 / 3);
                  IVar20.value_ = 0xffffffff;
                  uVar18 = 0xffffffff;
                }
                else {
                  uVar18 = local_68.value_ - 1;
LAB_0013fb36:
                  IVar20.value_ =
                       *(uint *)(*(long *)&(pCVar6->opposite_corners_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                + (ulong)uVar18 * 4);
                  iVar25 = (int)(uVar17 / 3);
                  if (local_5c.value_ == 0xffffffff) {
                    iVar25 = -1;
                  }
                  uVar18 = IVar20.value_ / 3;
                  if (IVar20.value_ == 0xffffffff) {
                    uVar18 = 0xffffffff;
                  }
                }
                local_58 = iVar15;
                bVar12 = IsRightFaceVisited(this,(CornerIndex)local_68.value_);
                if (!bVar12) {
                  bVar12 = IsLeftFaceVisited(this,(CornerIndex)local_68.value_);
                  iVar25 = local_60;
                  if (!bVar12) goto LAB_0013ffcc;
                  if (uVar18 != 0xffffffff) {
                    CheckAndStoreTopologySplitEvent
                              (this,this->last_encoded_symbol_id_,uVar26,LEFT_FACE_EDGE,uVar18);
                  }
LAB_0013fc3b:
                  piVar2 = &(this->traversal_encoder_).num_symbols_;
                  *piVar2 = *piVar2 + 1;
                  uVar26 = (this->traversal_encoder_).last_corner_.value_;
                  if ((ulong)uVar26 == 0xffffffff) {
                    uVar18 = 0xffffffff;
                    uVar19 = 0xffffffff;
                  }
                  else {
                    uVar18 = uVar26 - 2;
                    if (0x55555555 < uVar26 * -0x55555555 + 0xaaaaaaab) {
                      uVar18 = uVar26 + 1;
                    }
                    if (uVar26 * -0x55555555 < 0x55555556) {
                      uVar19 = uVar26 + 2;
                    }
                    else {
                      uVar19 = uVar26 - 1;
                    }
                  }
                  pIVar8 = (this->traversal_encoder_).corner_to_vertex_map_.vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  piVar9 = (this->traversal_encoder_).vertex_valences_.vector_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar15 = piVar9[pIVar8[uVar18].value_];
                  piVar9[pIVar8[uVar26].value_] = piVar9[pIVar8[uVar26].value_] + -1;
                  piVar9[pIVar8[uVar18].value_] = piVar9[pIVar8[uVar18].value_] + -2;
                  piVar9[pIVar8[uVar19].value_] = piVar9[pIVar8[uVar19].value_] + -1;
                  lVar13 = (long)(this->traversal_encoder_).prev_symbol_;
                  if (lVar13 != -1) {
                    iVar22 = (this->traversal_encoder_).min_valence_;
                    iVar21 = (this->traversal_encoder_).max_valence_;
                    if (iVar15 < iVar21) {
                      iVar21 = iVar15;
                    }
                    iVar21 = iVar21 - iVar22;
                    if (iVar15 < iVar22) {
                      iVar21 = 0;
                    }
                    pvVar4 = (this->traversal_encoder_).context_symbols_.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar21;
                    local_64 = *(uint *)(edge_breaker_topology_to_symbol_id + lVar13 * 4);
                    iVar10._M_current =
                         (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar10._M_current ==
                        (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>(pvVar4,iVar10,&local_64);
                    }
                    else {
                      *iVar10._M_current = local_64;
                      (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                    }
                  }
                  (this->traversal_encoder_).prev_symbol_ = 3;
                  IVar20.value_ = local_5c.value_;
                  goto LAB_0013fe3a;
                }
                if (iVar25 != -1) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,uVar26,RIGHT_FACE_EDGE,iVar25);
                }
                bVar12 = IsLeftFaceVisited(this,(CornerIndex)local_68.value_);
                if (bVar12) {
                  if (uVar18 != 0xffffffff) {
                    CheckAndStoreTopologySplitEvent
                              (this,this->last_encoded_symbol_id_,uVar26,LEFT_FACE_EDGE,uVar18);
                  }
LAB_0013ff77:
                  piVar2 = &(this->traversal_encoder_).num_symbols_;
                  *piVar2 = *piVar2 + 1;
                  uVar26 = (this->traversal_encoder_).last_corner_.value_;
                  if ((ulong)uVar26 == 0xffffffff) {
                    uVar18 = 0xffffffff;
                    uVar19 = 0xffffffff;
                  }
                  else {
                    uVar18 = uVar26 - 2;
                    if (0x55555555 < uVar26 * -0x55555555 + 0xaaaaaaab) {
                      uVar18 = uVar26 + 1;
                    }
                    if (uVar26 * -0x55555555 < 0x55555556) {
                      uVar19 = uVar26 + 2;
                    }
                    else {
                      uVar19 = uVar26 - 1;
                    }
                  }
                  pIVar8 = (this->traversal_encoder_).corner_to_vertex_map_.vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  piVar9 = (this->traversal_encoder_).vertex_valences_.vector_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar25 = piVar9[pIVar8[uVar18].value_];
                  piVar9[pIVar8[uVar26].value_] = piVar9[pIVar8[uVar26].value_] + -2;
                  piVar9[pIVar8[uVar18].value_] = piVar9[pIVar8[uVar18].value_] + -2;
                  piVar9[pIVar8[uVar19].value_] = piVar9[pIVar8[uVar19].value_] + -2;
                  lVar13 = (long)(this->traversal_encoder_).prev_symbol_;
                  if (lVar13 != -1) {
                    iVar15 = (this->traversal_encoder_).min_valence_;
                    iVar22 = (this->traversal_encoder_).max_valence_;
                    if (iVar25 < iVar22) {
                      iVar22 = iVar25;
                    }
                    iVar22 = iVar22 - iVar15;
                    if (iVar25 < iVar15) {
                      iVar22 = 0;
                    }
                    pvVar4 = (this->traversal_encoder_).context_symbols_.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar22;
                    local_64 = *(uint *)(edge_breaker_topology_to_symbol_id + lVar13 * 4);
                    iVar10._M_current =
                         (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar10._M_current ==
                        (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>(pvVar4,iVar10,&local_64);
                    }
                    else {
                      *iVar10._M_current = local_64;
                      (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                    }
                  }
                  (this->traversal_encoder_).prev_symbol_ = 7;
                  ppIVar1 = &(this->corner_traversal_stack_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + -1;
                  break;
                }
              }
              iVar25 = local_60;
              piVar2 = &(this->traversal_encoder_).num_symbols_;
              *piVar2 = *piVar2 + 1;
              uVar26 = (this->traversal_encoder_).last_corner_.value_;
              if ((ulong)uVar26 == 0xffffffff) {
                uVar18 = 0xffffffff;
                uVar19 = 0xffffffff;
              }
              else {
                uVar18 = uVar26 - 2;
                if (0x55555555 < uVar26 * -0x55555555 + 0xaaaaaaab) {
                  uVar18 = uVar26 + 1;
                }
                if (uVar26 * -0x55555555 < 0x55555556) {
                  uVar19 = uVar26 + 2;
                }
                else {
                  uVar19 = uVar26 - 1;
                }
              }
              pIVar8 = (this->traversal_encoder_).corner_to_vertex_map_.vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar9 = (this->traversal_encoder_).vertex_valences_.vector_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              iVar15 = piVar9[pIVar8[uVar18].value_];
              piVar9[pIVar8[uVar26].value_] = piVar9[pIVar8[uVar26].value_] + -1;
              piVar9[pIVar8[uVar18].value_] = piVar9[pIVar8[uVar18].value_] + -1;
              piVar9[pIVar8[uVar19].value_] = piVar9[pIVar8[uVar19].value_] + -2;
              lVar13 = (long)(this->traversal_encoder_).prev_symbol_;
              if (lVar13 != -1) {
                iVar22 = (this->traversal_encoder_).min_valence_;
                iVar21 = (this->traversal_encoder_).max_valence_;
                if (iVar15 < iVar21) {
                  iVar21 = iVar15;
                }
                iVar21 = iVar21 - iVar22;
                if (iVar15 < iVar22) {
                  iVar21 = 0;
                }
                pvVar4 = (this->traversal_encoder_).context_symbols_.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar21;
                local_64 = *(uint *)(edge_breaker_topology_to_symbol_id + lVar13 * 4);
                iVar10._M_current =
                     (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>(pvVar4,iVar10,&local_64);
                }
                else {
                  *iVar10._M_current = local_64;
                  (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                }
              }
              (this->traversal_encoder_).prev_symbol_ = 5;
            }
LAB_0013fe3a:
            iVar25 = iVar25 + -1;
          } while (iVar25 != 0);
        }
      }
      pIVar24 = (this->corner_traversal_stack_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != pIVar24);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivityFromCorner(
    CornerIndex corner_id) {
  corner_traversal_stack_.clear();
  corner_traversal_stack_.push_back(corner_id);
  const int num_faces = mesh_->num_faces();
  while (!corner_traversal_stack_.empty()) {
    // Currently processed corner.
    corner_id = corner_traversal_stack_.back();
    // Make sure the face hasn't been visited yet.
    if (corner_id == kInvalidCornerIndex ||
        visited_faces_[corner_table_->Face(corner_id).value()]) {
      // This face has been already traversed.
      corner_traversal_stack_.pop_back();
      continue;
    }
    int num_visited_faces = 0;
    while (num_visited_faces < num_faces) {
      // Mark the current face as visited.
      ++num_visited_faces;
      ++last_encoded_symbol_id_;

      const FaceIndex face_id = corner_table_->Face(corner_id);
      visited_faces_[face_id.value()] = true;
      processed_connectivity_corners_.push_back(corner_id);
      traversal_encoder_.NewCornerReached(corner_id);
      const VertexIndex vert_id = corner_table_->Vertex(corner_id);
      const bool on_boundary = (vertex_hole_id_[vert_id.value()] != -1);
      if (!IsVertexVisited(vert_id)) {
        // A new unvisited vertex has been reached. We need to store its
        // position difference using next, prev, and opposite vertices.
        visited_vertex_ids_[vert_id.value()] = true;
        if (!on_boundary) {
          // If the vertex is on boundary it must correspond to an unvisited
          // hole and it will be encoded with TOPOLOGY_S symbol later).
          traversal_encoder_.EncodeSymbol(TOPOLOGY_C);
          // Move to the right triangle.
          corner_id = GetRightCorner(corner_id);
          continue;
        }
      }
      // The current vertex has been already visited or it was on a boundary.
      // We need to determine whether we can visit any of it's neighboring
      // faces.
      const CornerIndex right_corner_id = GetRightCorner(corner_id);
      const CornerIndex left_corner_id = GetLeftCorner(corner_id);
      const FaceIndex right_face_id = corner_table_->Face(right_corner_id);
      const FaceIndex left_face_id = corner_table_->Face(left_corner_id);
      if (IsRightFaceVisited(corner_id)) {
        // Right face has been already visited.
        // Check whether there is a topology split event.
        if (right_face_id != kInvalidFaceIndex) {
          CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                          face_id.value(), RIGHT_FACE_EDGE,
                                          right_face_id.value());
        }
        if (IsLeftFaceVisited(corner_id)) {
          // Both neighboring faces are visited. End reached.
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_E);
          corner_traversal_stack_.pop_back();
          break;  // Break from the while (num_visited_faces < num_faces) loop.
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_R);
          // Go to the left face.
          corner_id = left_corner_id;
        }
      } else {
        // Right face was not visited.
        if (IsLeftFaceVisited(corner_id)) {
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_L);
          // Left face visited, go to the right one.
          corner_id = right_corner_id;
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_S);
          ++num_split_symbols_;
          // Both neighboring faces are unvisited, we need to visit both of
          // them.
          if (on_boundary) {
            // The tip vertex is on a hole boundary. If the hole hasn't been
            // visited yet we need to encode it.
            const int hole_id = vertex_hole_id_[vert_id.value()];
            if (!visited_holes_[hole_id]) {
              EncodeHole(corner_id, false);
            }
          }
          face_to_split_symbol_map_[face_id.value()] = last_encoded_symbol_id_;
          // Split the traversal.
          // First make the top of the current corner stack point to the left
          // face (this one will be processed second).
          corner_traversal_stack_.back() = left_corner_id;
          // Add a new corner to the top of the stack (right face needs to
          // be traversed first).
          corner_traversal_stack_.push_back(right_corner_id);
          // Break from the while (num_visited_faces < num_faces) loop.
          break;
        }
      }
    }
  }
  return true;  // All corners have been processed.
}